

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_v_predictor_32x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  ushort uVar15;
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  unkuint9 Var18;
  undefined1 auVar19 [11];
  undefined1 auVar20 [13];
  undefined1 auVar21 [15];
  unkuint9 Var22;
  undefined1 auVar23 [11];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  uint uVar28;
  uint8_t *puVar29;
  short sVar30;
  short sVar33;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  short sVar34;
  ushort uVar35;
  short sVar36;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  short sVar44;
  ushort uVar45;
  ushort uVar46;
  short sVar47;
  ushort uVar48;
  ushort uVar49;
  short sVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  short sVar64;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  undefined1 auVar65 [16];
  short sVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  
  auVar32 = _DAT_0050f440;
  auVar31 = pshuflw(ZEXT116(left_column[0xf]),ZEXT116(left_column[0xf]),0);
  auVar1 = *(undefined1 (*) [16])top_row;
  auVar2 = *(undefined1 (*) [16])(top_row + 0x10);
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar1._0_13_;
  auVar4[0xe] = auVar1[7];
  auVar6[0xc] = auVar1[6];
  auVar6._0_12_ = auVar1._0_12_;
  auVar6._13_2_ = auVar4._13_2_;
  auVar8[0xb] = 0;
  auVar8._0_11_ = auVar1._0_11_;
  auVar8._12_3_ = auVar6._12_3_;
  auVar10[10] = auVar1[5];
  auVar10._0_10_ = auVar1._0_10_;
  auVar10._11_4_ = auVar8._11_4_;
  auVar12[9] = 0;
  auVar12._0_9_ = auVar1._0_9_;
  auVar12._10_5_ = auVar10._10_5_;
  auVar14[8] = auVar1[4];
  auVar14._0_8_ = auVar1._0_8_;
  auVar14._9_6_ = auVar12._9_6_;
  auVar17._7_8_ = 0;
  auVar17._0_7_ = auVar14._8_7_;
  Var18 = CONCAT81(SUB158(auVar17 << 0x40,7),auVar1[3]);
  auVar24._9_6_ = 0;
  auVar24._0_9_ = Var18;
  auVar19._1_10_ = SUB1510(auVar24 << 0x30,5);
  auVar19[0] = auVar1[2];
  auVar25._11_4_ = 0;
  auVar25._0_11_ = auVar19;
  auVar20._1_12_ = SUB1512(auVar25 << 0x20,3);
  auVar20[0] = auVar1[1];
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar2._0_13_;
  auVar3[0xe] = auVar2[7];
  auVar5[0xc] = auVar2[6];
  auVar5._0_12_ = auVar2._0_12_;
  auVar5._13_2_ = auVar3._13_2_;
  auVar7[0xb] = 0;
  auVar7._0_11_ = auVar2._0_11_;
  auVar7._12_3_ = auVar5._12_3_;
  auVar9[10] = auVar2[5];
  auVar9._0_10_ = auVar2._0_10_;
  auVar9._11_4_ = auVar7._11_4_;
  auVar11[9] = 0;
  auVar11._0_9_ = auVar2._0_9_;
  auVar11._10_5_ = auVar9._10_5_;
  auVar13[8] = auVar2[4];
  auVar13._0_8_ = auVar2._0_8_;
  auVar13._9_6_ = auVar11._9_6_;
  auVar21._7_8_ = 0;
  auVar21._0_7_ = auVar13._8_7_;
  Var22 = CONCAT81(SUB158(auVar21 << 0x40,7),auVar2[3]);
  auVar26._9_6_ = 0;
  auVar26._0_9_ = Var22;
  auVar23._1_10_ = SUB1510(auVar26 << 0x30,5);
  auVar23[0] = auVar2[2];
  auVar27._11_4_ = 0;
  auVar27._0_11_ = auVar23;
  auVar16[2] = auVar2[1];
  auVar16._0_2_ = auVar2._0_2_;
  auVar16._3_12_ = SUB1512(auVar27 << 0x20,3);
  uVar35 = auVar2._0_2_ & 0xff;
  sVar30 = auVar31._0_2_;
  sVar33 = auVar31._2_2_;
  auVar31._2_2_ = sVar33 * 0x1f;
  auVar31._0_2_ = sVar30;
  auVar31._4_2_ = sVar30 * 0x3c;
  auVar31._6_2_ = sVar33 * 0x56;
  auVar31._8_2_ = sVar30 * 0x6f;
  auVar31._10_2_ = sVar33 * 0x85;
  auVar31._12_2_ = sVar30 * 0x9a;
  auVar31._14_2_ = sVar33 * 0xac;
  puVar29 = dst + 0x10;
  uVar28 = 0xfefdfefe;
  do {
    uVar28 = uVar28 + 0x2020202;
    auVar65._4_4_ = uVar28;
    auVar65._0_4_ = uVar28;
    auVar65._8_4_ = uVar28;
    auVar65._12_4_ = uVar28;
    auVar37 = pshufb(auVar32,auVar65);
    auVar65 = pshufb(auVar31,auVar65);
    sVar39 = auVar37._0_2_;
    sVar40 = auVar37._2_2_;
    sVar41 = auVar37._4_2_;
    sVar34 = (short)Var18;
    sVar42 = auVar37._6_2_;
    sVar43 = auVar37._8_2_;
    sVar44 = auVar37._10_2_;
    sVar47 = auVar37._12_2_;
    sVar50 = auVar37._14_2_;
    uVar15 = auVar4._13_2_ >> 8;
    sVar64 = auVar65._0_2_ + 0x80;
    sVar66 = auVar65._2_2_ + 0x80;
    sVar67 = auVar65._4_2_ + 0x80;
    sVar68 = auVar65._6_2_ + 0x80;
    sVar69 = auVar65._8_2_ + 0x80;
    sVar70 = auVar65._10_2_ + 0x80;
    sVar71 = auVar65._12_2_ + 0x80;
    sVar72 = auVar65._14_2_ + 0x80;
    uVar45 = sVar39 * (ushort)auVar1[0] + sVar64;
    uVar48 = sVar40 * auVar20._0_2_ + sVar66;
    uVar51 = sVar41 * auVar19._0_2_ + sVar67;
    uVar53 = sVar42 * sVar34 + sVar68;
    uVar55 = sVar43 * auVar14._8_2_ + sVar69;
    uVar57 = sVar44 * auVar10._10_2_ + sVar70;
    uVar59 = sVar47 * auVar6._12_2_ + sVar71;
    uVar61 = sVar50 * uVar15 + sVar72;
    uVar46 = uVar45 >> 8;
    uVar49 = uVar48 >> 8;
    uVar52 = uVar51 >> 8;
    uVar54 = uVar53 >> 8;
    uVar56 = uVar55 >> 8;
    uVar58 = uVar57 >> 8;
    uVar60 = uVar59 >> 8;
    uVar62 = uVar61 >> 8;
    uVar73 = sVar39 * (ushort)auVar1[8] + sVar64;
    uVar75 = sVar40 * (ushort)auVar1[9] + sVar66;
    uVar77 = sVar41 * (ushort)auVar1[10] + sVar67;
    uVar79 = sVar42 * (ushort)auVar1[0xb] + sVar68;
    uVar81 = sVar43 * (ushort)auVar1[0xc] + sVar69;
    uVar83 = sVar44 * (ushort)auVar1[0xd] + sVar70;
    uVar85 = sVar47 * (ushort)auVar1[0xe] + sVar71;
    uVar87 = sVar50 * (ushort)auVar1[0xf] + sVar72;
    uVar74 = uVar73 >> 8;
    uVar76 = uVar75 >> 8;
    uVar78 = uVar77 >> 8;
    uVar80 = uVar79 >> 8;
    uVar82 = uVar81 >> 8;
    uVar84 = uVar83 >> 8;
    uVar86 = uVar85 >> 8;
    uVar88 = uVar87 >> 8;
    puVar29[-0x10] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46);
    puVar29[-0xf] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
    puVar29[-0xe] = (uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52);
    puVar29[-0xd] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54);
    puVar29[-0xc] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
    puVar29[-0xb] = (uVar58 != 0) * (uVar58 < 0x100) * (char)(uVar57 >> 8) - (0xff < uVar58);
    puVar29[-10] = (uVar60 != 0) * (uVar60 < 0x100) * (char)(uVar59 >> 8) - (0xff < uVar60);
    puVar29[-9] = (uVar62 != 0) * (uVar62 < 0x100) * (char)(uVar61 >> 8) - (0xff < uVar62);
    puVar29[-8] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
    puVar29[-7] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    puVar29[-6] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar29[-5] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
    puVar29[-4] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar82);
    puVar29[-3] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar29[-2] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
    puVar29[-1] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    sVar36 = (short)Var22;
    uVar45 = auVar3._13_2_ >> 8;
    uVar74 = sVar39 * uVar35 + sVar64;
    uVar76 = sVar40 * auVar16._2_2_ + sVar66;
    uVar78 = sVar41 * auVar23._0_2_ + sVar67;
    uVar80 = sVar42 * sVar36 + sVar68;
    uVar82 = sVar43 * auVar13._8_2_ + sVar69;
    uVar84 = sVar44 * auVar9._10_2_ + sVar70;
    uVar86 = sVar47 * auVar5._12_2_ + sVar71;
    uVar88 = sVar50 * uVar45 + sVar72;
    uVar75 = uVar74 >> 8;
    uVar77 = uVar76 >> 8;
    uVar79 = uVar78 >> 8;
    uVar81 = uVar80 >> 8;
    uVar83 = uVar82 >> 8;
    uVar85 = uVar84 >> 8;
    uVar87 = uVar86 >> 8;
    uVar63 = uVar88 >> 8;
    uVar46 = sVar39 * (ushort)auVar2[8] + sVar64;
    uVar49 = sVar40 * (ushort)auVar2[9] + sVar66;
    uVar52 = sVar41 * (ushort)auVar2[10] + sVar67;
    uVar54 = sVar42 * (ushort)auVar2[0xb] + sVar68;
    uVar56 = sVar43 * (ushort)auVar2[0xc] + sVar69;
    uVar58 = sVar44 * (ushort)auVar2[0xd] + sVar70;
    uVar60 = sVar47 * (ushort)auVar2[0xe] + sVar71;
    uVar62 = sVar50 * (ushort)auVar2[0xf] + sVar72;
    uVar48 = uVar46 >> 8;
    uVar51 = uVar49 >> 8;
    uVar53 = uVar52 >> 8;
    uVar55 = uVar54 >> 8;
    uVar57 = uVar56 >> 8;
    uVar59 = uVar58 >> 8;
    uVar61 = uVar60 >> 8;
    uVar73 = uVar62 >> 8;
    *puVar29 = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
    puVar29[1] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
    puVar29[2] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    puVar29[3] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
    puVar29[4] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar83);
    puVar29[5] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    puVar29[6] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    puVar29[7] = (uVar63 != 0) * (uVar63 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar63);
    puVar29[8] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar48);
    puVar29[9] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar51);
    puVar29[10] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
    puVar29[0xb] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
    puVar29[0xc] = (uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar57);
    puVar29[0xd] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
    puVar29[0xe] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
    puVar29[0xf] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar73);
    auVar37 = _DAT_0050f470;
    puVar29 = puVar29 + stride;
  } while (uVar28 < 0xd0c0d0d);
  auVar32._0_2_ = sVar30 * 0xbc;
  auVar32._2_2_ = sVar33 * 0xca;
  auVar32._4_2_ = sVar30 * 0xd5;
  auVar32._6_2_ = sVar33 * 0xdf;
  auVar32._8_2_ = sVar30 * 0xe6;
  auVar32._10_2_ = sVar33 * 0xec;
  auVar32._12_2_ = sVar30 * 0xef;
  auVar32._14_2_ = sVar33 * 0xf0;
  uVar28 = 0xfefdfefe;
  do {
    uVar28 = uVar28 + 0x2020202;
    auVar38._4_4_ = uVar28;
    auVar38._0_4_ = uVar28;
    auVar38._8_4_ = uVar28;
    auVar38._12_4_ = uVar28;
    auVar31 = pshufb(auVar37,auVar38);
    auVar65 = pshufb(auVar32,auVar38);
    sVar30 = auVar31._0_2_;
    sVar33 = auVar31._2_2_;
    sVar39 = auVar31._4_2_;
    sVar40 = auVar31._6_2_;
    sVar41 = auVar31._8_2_;
    sVar42 = auVar31._10_2_;
    sVar43 = auVar31._12_2_;
    sVar44 = auVar31._14_2_;
    sVar47 = auVar65._0_2_ + 0x80;
    sVar50 = auVar65._2_2_ + 0x80;
    sVar64 = auVar65._4_2_ + 0x80;
    sVar66 = auVar65._6_2_ + 0x80;
    sVar67 = auVar65._8_2_ + 0x80;
    sVar68 = auVar65._10_2_ + 0x80;
    sVar69 = auVar65._12_2_ + 0x80;
    sVar70 = auVar65._14_2_ + 0x80;
    uVar46 = sVar30 * (ushort)auVar1[0] + sVar47;
    uVar49 = sVar33 * auVar20._0_2_ + sVar50;
    uVar52 = sVar39 * auVar19._0_2_ + sVar64;
    uVar54 = sVar40 * sVar34 + sVar66;
    uVar56 = sVar41 * auVar14._8_2_ + sVar67;
    uVar58 = sVar42 * auVar10._10_2_ + sVar68;
    uVar60 = sVar43 * auVar6._12_2_ + sVar69;
    uVar62 = sVar44 * uVar15 + sVar70;
    uVar48 = uVar46 >> 8;
    uVar51 = uVar49 >> 8;
    uVar53 = uVar52 >> 8;
    uVar55 = uVar54 >> 8;
    uVar57 = uVar56 >> 8;
    uVar59 = uVar58 >> 8;
    uVar61 = uVar60 >> 8;
    uVar73 = uVar62 >> 8;
    uVar74 = sVar30 * (ushort)auVar1[8] + sVar47;
    uVar76 = sVar33 * (ushort)auVar1[9] + sVar50;
    uVar78 = sVar39 * (ushort)auVar1[10] + sVar64;
    uVar80 = sVar40 * (ushort)auVar1[0xb] + sVar66;
    uVar82 = sVar41 * (ushort)auVar1[0xc] + sVar67;
    uVar84 = sVar42 * (ushort)auVar1[0xd] + sVar68;
    uVar86 = sVar43 * (ushort)auVar1[0xe] + sVar69;
    uVar88 = sVar44 * (ushort)auVar1[0xf] + sVar70;
    uVar75 = uVar74 >> 8;
    uVar77 = uVar76 >> 8;
    uVar79 = uVar78 >> 8;
    uVar81 = uVar80 >> 8;
    uVar83 = uVar82 >> 8;
    uVar85 = uVar84 >> 8;
    uVar87 = uVar86 >> 8;
    uVar63 = uVar88 >> 8;
    puVar29[-0x10] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar48);
    puVar29[-0xf] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar51);
    puVar29[-0xe] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
    puVar29[-0xd] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
    puVar29[-0xc] = (uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar57);
    puVar29[-0xb] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
    puVar29[-10] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
    puVar29[-9] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar73);
    puVar29[-8] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
    puVar29[-7] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
    puVar29[-6] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    puVar29[-5] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
    puVar29[-4] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar83);
    puVar29[-3] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    puVar29[-2] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    puVar29[-1] = (uVar63 != 0) * (uVar63 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar63);
    uVar74 = sVar30 * uVar35 + sVar47;
    uVar76 = sVar33 * auVar16._2_2_ + sVar50;
    uVar78 = sVar39 * auVar23._0_2_ + sVar64;
    uVar80 = sVar40 * sVar36 + sVar66;
    uVar82 = sVar41 * auVar13._8_2_ + sVar67;
    uVar84 = sVar42 * auVar9._10_2_ + sVar68;
    uVar86 = sVar43 * auVar5._12_2_ + sVar69;
    uVar88 = sVar44 * uVar45 + sVar70;
    uVar75 = uVar74 >> 8;
    uVar77 = uVar76 >> 8;
    uVar79 = uVar78 >> 8;
    uVar81 = uVar80 >> 8;
    uVar83 = uVar82 >> 8;
    uVar85 = uVar84 >> 8;
    uVar87 = uVar86 >> 8;
    uVar63 = uVar88 >> 8;
    uVar46 = sVar30 * (ushort)auVar2[8] + sVar47;
    uVar49 = sVar33 * (ushort)auVar2[9] + sVar50;
    uVar52 = sVar39 * (ushort)auVar2[10] + sVar64;
    uVar54 = sVar40 * (ushort)auVar2[0xb] + sVar66;
    uVar56 = sVar41 * (ushort)auVar2[0xc] + sVar67;
    uVar58 = sVar42 * (ushort)auVar2[0xd] + sVar68;
    uVar60 = sVar43 * (ushort)auVar2[0xe] + sVar69;
    uVar62 = sVar44 * (ushort)auVar2[0xf] + sVar70;
    uVar48 = uVar46 >> 8;
    uVar51 = uVar49 >> 8;
    uVar53 = uVar52 >> 8;
    uVar55 = uVar54 >> 8;
    uVar57 = uVar56 >> 8;
    uVar59 = uVar58 >> 8;
    uVar61 = uVar60 >> 8;
    uVar73 = uVar62 >> 8;
    *puVar29 = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar74 >> 8) - (0xff < uVar75);
    puVar29[1] = (uVar77 != 0) * (uVar77 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar77);
    puVar29[2] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
    puVar29[3] = (uVar81 != 0) * (uVar81 < 0x100) * (char)(uVar80 >> 8) - (0xff < uVar81);
    puVar29[4] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar83);
    puVar29[5] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    puVar29[6] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    puVar29[7] = (uVar63 != 0) * (uVar63 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar63);
    puVar29[8] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar48);
    puVar29[9] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar51);
    puVar29[10] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
    puVar29[0xb] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
    puVar29[0xc] = (uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar57);
    puVar29[0xd] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
    puVar29[0xe] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
    puVar29[0xf] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar73);
    puVar29 = puVar29 + stride;
  } while (uVar28 < 0xd0c0d0d);
  return;
}

Assistant:

void aom_smooth_v_predictor_32x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bottom_left = _mm_set1_epi16(left_column[15]);
  const __m128i top_lo = LoadUnaligned16(top_row);
  const __m128i top_hi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lo, zero);
  const __m128i top3 = cvtepu8_epi16(top_hi);
  const __m128i top4 = _mm_unpackhi_epi8(top_hi, zero);
  const __m128i weights = LoadUnaligned16(smooth_weights + 12);
  const __m128i weights1 = cvtepu8_epi16(weights);
  const __m128i weights2 = _mm_unpackhi_epi8(weights, zero);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}